

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::FillColumnAddPalCommand::Execute(FillColumnAddPalCommand *this,DrawerThread *thread)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint32_t *puVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar8;
  
  puVar2 = (this->super_PalColumnCommand)._dest;
  puVar3 = (this->super_PalColumnCommand)._destblend;
  uVar1 = (this->super_PalColumnCommand)._srccolor;
  lVar6 = (long)(this->super_PalColumnCommand)._pitch;
  iVar4 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                     *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < iVar4) {
    iVar5 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    pbVar8 = puVar2 + iVar5 * lVar6;
    iVar5 = thread->num_cores;
    do {
      uVar7 = puVar3[*pbVar8] + uVar1 | 0x1f07c1f;
      *pbVar8 = RGB32k.All[uVar7 >> 0xf & uVar7];
      pbVar8 = pbVar8 + iVar5 * lVar6;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void FillColumnAddPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;

		count = _count;
		dest = _dest;
		uint32_t *bg2rgb;
		uint32_t fg;

		bg2rgb = _destblend;
		fg = _srccolor;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		pitch *= thread->num_cores;

		do
		{
			uint32_t bg;
			bg = (fg + bg2rgb[*dest]) | 0x1f07c1f;
			*dest = RGB32k.All[bg & (bg >> 15)];
			dest += pitch;
		} while (--count);

	}